

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

void __thiscall mjs::function_base::base_print(function_base *this,wostream *os)

{
  ulong uVar1;
  wostream *pwVar2;
  size_type sVar3;
  const_reference pvVar4;
  element_type *sn;
  ulong local_20;
  size_t i;
  wostream *os_local;
  function_base *this_local;
  
  std::operator<<(os,"{");
  uVar1 = std::__cxx11::wstring::empty();
  if ((uVar1 & 1) == 0) {
    pwVar2 = std::operator<<(os,(wstring *)&this->id_);
    std::operator<<(pwVar2,", ");
  }
  std::operator<<(os,"[");
  local_20 = 0;
  while( true ) {
    sVar3 = std::
            vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
            ::size(&this->params_);
    if (sVar3 <= local_20) break;
    if (local_20 != 0) {
      std::operator<<(os,", ");
    }
    pvVar4 = std::
             vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
             ::operator[](&this->params_,local_20);
    std::operator<<(os,(wstring *)pvVar4);
    local_20 = local_20 + 1;
  }
  pwVar2 = std::operator<<(os,"], ");
  sn = std::__shared_ptr_access<mjs::block_statement,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
       operator*((__shared_ptr_access<mjs::block_statement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)&this->block_);
  pwVar2 = mjs::operator<<(pwVar2,(syntax_node *)sn);
  std::operator<<(pwVar2,"}");
  return;
}

Assistant:

void function_base::base_print(std::wostream& os) const {
    os << "{";
    if (!id_.empty()) os << id_ << ", ";
    os << "[";
    for (size_t i = 0; i < params_.size(); ++i) {
        if (i) os << ", ";
        os << params_[i];
    }
    os << "], " << *block_ << "}";
}